

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.h
# Opt level: O0

Scope * __thiscall
FactoredDecPOMDPDiscrete::GetStateFactorScopeForLRF(FactoredDecPOMDPDiscrete *this,Index LRF)

{
  const_reference pvVar1;
  undefined4 in_ESI;
  size_type in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar1 = std::vector<Scope,_std::allocator<Scope>_>::at
                     ((vector<Scope,_std::allocator<Scope>_> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return pvVar1;
}

Assistant:

const Scope& GetStateFactorScopeForLRF(Index LRF) const
    {return _m_sfScopes.at(LRF); }